

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::drawTableCell
          (QTextDocumentLayoutPrivate *this,QRectF *cellRect,QPainter *painter,
          PaintContext *cell_context,QTextTable *table,QTextTableData *td,int r,int c,
          QTextBlock *cursorBlockNeedingRepaint,QPointF *cursorBlockOffset)

{
  qreal qVar1;
  qreal qVar2;
  qreal qVar3;
  Iterator it;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  BorderStyle BVar8;
  BrushStyle BVar9;
  int *piVar10;
  double *pdVar11;
  const_reference pQVar12;
  long in_RCX;
  QPainter *pQVar13;
  QRectF *in_RSI;
  long in_R9;
  long in_FS_OFFSET;
  QSizeF QVar14;
  QPointF QVar15;
  int in_stack_00000008;
  int in_stack_00000010;
  QTextBlock *in_stack_00000018;
  qreal *in_stack_00000020;
  int i;
  int bottomPage;
  int topPage;
  qreal pageHeight;
  BorderStyle cellBorder;
  qreal border;
  bool cellBorderConfigured;
  int headerRowCount;
  qreal bottomMargin;
  qreal topMargin;
  int cc;
  int cr;
  int cspan;
  int rspan;
  QPointF cellPos;
  QFixed verticalOffset;
  qreal bottom;
  qreal top;
  QRectF clipped;
  QPointF brushOrigin;
  QBrush bg;
  QRectF borderRect;
  QPen oldPen;
  QBrush oldBrush;
  QFixed topPadding;
  QFixed leftPadding;
  QTextBlock repaintBlock;
  QTextTableCell cell;
  QTextFormat *in_stack_fffffffffffffbc8;
  QPointF *in_stack_fffffffffffffbd0;
  QTextBlock *p;
  QRectF *in_stack_fffffffffffffbd8;
  QRectF *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  QTextTableData *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  QTextTableCell *this_00;
  int local_398;
  int local_394;
  QRectF *in_stack_fffffffffffffc78;
  QList<QTextFrame_*> *in_stack_fffffffffffffc80;
  PaintContext *in_stack_fffffffffffffc88;
  QPainter *in_stack_fffffffffffffc90;
  QPointF *in_stack_fffffffffffffc98;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffffca0;
  double dVar16;
  undefined1 *topMargin_00;
  undefined4 in_stack_fffffffffffffcb8;
  undefined2 in_stack_fffffffffffffcc8;
  byte bVar17;
  undefined1 uVar18;
  int local_324;
  undefined4 in_stack_fffffffffffffcf0;
  BorderStyle in_stack_fffffffffffffcf4;
  QTextTableData *in_stack_fffffffffffffcf8;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  QList<QTextFrame_*> *painter_00;
  QRectF *cellRect_00;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  QFixed local_27c;
  QPointF local_278;
  int local_264;
  qreal local_260;
  qreal local_258;
  undefined1 in_stack_fffffffffffffdc0 [16];
  qreal in_stack_fffffffffffffdd0;
  qreal in_stack_fffffffffffffdd8;
  qreal local_218;
  qreal local_210;
  qreal local_208;
  double local_200;
  double local_1f8;
  qreal local_1f0;
  double local_1e8;
  double local_1e0;
  QRect local_1d8;
  QRectF local_1c8;
  QRectF local_1a8;
  qreal local_188;
  qreal local_180;
  QSizeF local_170;
  QPoint local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 *local_148;
  QRectF local_138;
  PaintContext *local_110;
  undefined1 *local_108;
  QFixed local_100;
  QFixed local_fc;
  int local_f8;
  int local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  int local_e8;
  QFixed local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  int local_d8;
  QFixed local_d4;
  int local_d0;
  QFixed local_cc [3];
  QTextBlock *local_c0;
  QPainter *local_b8;
  undefined1 local_a8 [48];
  undefined1 local_78 [96];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::cellAt((QTextTable *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                     (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),(int)in_stack_fffffffffffffbe0)
  ;
  iVar6 = QTextTableCell::rowSpan((QTextTableCell *)in_stack_fffffffffffffbd8);
  iVar7 = QTextTableCell::columnSpan((QTextTableCell *)in_stack_fffffffffffffbd8);
  if (((iVar6 == 1) ||
      (iVar6 = QTextTableCell::row((QTextTableCell *)in_stack_fffffffffffffbd8),
      iVar6 == in_stack_00000008)) &&
     ((iVar7 == 1 ||
      (in_stack_fffffffffffffd1c =
            QTextTableCell::column((QTextTableCell *)in_stack_fffffffffffffbd8),
      in_stack_fffffffffffffd1c == in_stack_00000010)))) {
    local_cc[0].val = -0x55555556;
    local_cc[0] = QTextTableData::leftPadding
                            (in_stack_fffffffffffffbf0,
                             (QTextTable *)
                             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                             (QTextTableCell *)in_stack_fffffffffffffbe0);
    local_d0 = 0xaaaaaaaa;
    local_d0 = (int)QTextTableData::topPadding
                              (in_stack_fffffffffffffbf0,
                               (QTextTable *)
                               CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                               (QTextTableCell *)in_stack_fffffffffffffbe0);
    local_dc = *(undefined4 *)(in_R9 + 0x78);
    local_d8 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffbc8,
                                      (QFixed)(int)in_stack_fffffffffffffbd0);
    local_e0 = *(undefined4 *)(in_R9 + 0x28);
    local_d4 = QFixed::operator+((QFixed *)in_stack_fffffffffffffbc8,(int)in_stack_fffffffffffffbd0)
    ;
    cellRect_00 = (QRectF *)QFixed::toReal(&local_d4);
    local_ec = *(undefined4 *)(in_R9 + 0x78);
    local_e8 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffbc8,
                                      (QFixed)(int)in_stack_fffffffffffffbd0);
    local_f0 = *(undefined4 *)(in_R9 + 0x28);
    local_e4 = QFixed::operator+((QFixed *)in_stack_fffffffffffffbc8,(int)in_stack_fffffffffffffbd0)
    ;
    painter_00 = (QList<QTextFrame_*> *)QFixed::toReal(&local_e4);
    QTextTable::format((QTextTable *)in_stack_fffffffffffffbe0);
    local_f4 = QTextTableFormat::headerRowCount((QTextTableFormat *)0x7fc27f);
    local_f8 = QTextTable::rows((QTextTable *)in_stack_fffffffffffffbd0);
    local_f8 = local_f8 + -1;
    piVar10 = qMin<int>(&local_f4,&local_f8);
    iVar6 = *piVar10;
    QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7fc2c8);
    iVar7 = iVar6;
    if (iVar6 <= in_stack_00000008) {
      qVar1 = QFixed::toReal((QFixed *)(in_R9 + 0x140));
      cellRect_00 = (QRectF *)(qVar1 + (double)cellRect_00);
    }
    QTextTableCell::format
              ((QTextTableCell *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    bVar4 = QTextFormat::hasProperty
                      ((QTextFormat *)in_stack_fffffffffffffbe0,
                       (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
    bVar21 = 0;
    bVar20 = 0;
    bVar19 = 0;
    bVar17 = true;
    if (!bVar4) {
      QTextTableCell::format
                ((QTextTableCell *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      bVar21 = 1;
      bVar4 = QTextFormat::hasProperty
                        ((QTextFormat *)in_stack_fffffffffffffbe0,
                         (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      bVar17 = true;
      if (!bVar4) {
        QTextTableCell::format
                  ((QTextTableCell *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        bVar20 = 1;
        bVar4 = QTextFormat::hasProperty
                          ((QTextFormat *)in_stack_fffffffffffffbe0,
                           (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
        bVar17 = true;
        if (!bVar4) {
          QTextTableCell::format
                    ((QTextTableCell *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)
                    );
          bVar19 = 1;
          bVar17 = QTextFormat::hasProperty
                             ((QTextFormat *)in_stack_fffffffffffffbe0,
                              (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
        }
      }
    }
    uVar18 = bVar17;
    if ((bVar19 & 1) != 0) {
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7fc43a);
    }
    if ((bVar20 & 1) != 0) {
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7fc453);
    }
    if ((bVar21 & 1) != 0) {
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7fc46c);
    }
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7fc479);
    bVar5 = bVar17 & 1;
    if ((*(byte *)(in_R9 + 0x148) & 1) == 0) {
      local_fc.val = *(int *)(in_R9 + 0x28);
      QFixed::QFixed(&local_100,0);
      bVar4 = ::operator!=(local_fc,local_100);
      if ((bVar4) && ((bVar5 & 1) == 0)) {
        in_stack_fffffffffffffc88 = (PaintContext *)&DAT_aaaaaaaaaaaaaaaa;
        local_108 = &DAT_aaaaaaaaaaaaaaaa;
        QPainter::brush((QPainter *)in_stack_fffffffffffffbd0);
        QBrush::QBrush((QBrush *)in_stack_fffffffffffffbd0,(QBrush *)in_stack_fffffffffffffbc8);
        local_110 = in_stack_fffffffffffffc88;
        QPainter::pen((QPainter *)in_stack_fffffffffffffbd0);
        QPen::QPen((QPen *)in_stack_fffffffffffffbd0,(QPen *)in_stack_fffffffffffffbc8);
        in_stack_fffffffffffffcf8 = (QTextTableData *)0x3ff0000000000000;
        local_138.w = -NAN;
        local_138.h = -NAN;
        local_138.xp = -NAN;
        local_138.yp = -NAN;
        qVar1 = QRectF::left(in_RSI);
        in_stack_fffffffffffffc90 = (QPainter *)0x3ff0000000000000;
        dVar16 = qVar1 - 1.0;
        qVar1 = QRectF::top(in_RSI);
        in_stack_fffffffffffffc98 = (QPointF *)(qVar1 - (double)in_stack_fffffffffffffc90);
        qVar1 = QRectF::width(in_RSI);
        in_stack_fffffffffffffca0 =
             (QTextDocumentLayoutPrivate *)(qVar1 + (double)in_stack_fffffffffffffc90);
        qVar1 = QRectF::height(in_RSI);
        QRectF::QRectF(&local_138,dVar16,(qreal)in_stack_fffffffffffffc98,
                       (qreal)in_stack_fffffffffffffca0,qVar1 + (double)in_stack_fffffffffffffc90);
        topMargin_00 = local_78;
        QTextTable::format((QTextTable *)in_stack_fffffffffffffbe0);
        BVar8 = QTextFrameFormat::borderStyle((QTextFrameFormat *)0x7fc65d);
        in_stack_fffffffffffffc80 = painter_00;
        in_stack_fffffffffffffc78 = cellRect_00;
        QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7fc671);
        pQVar13 = (QPainter *)(ulong)(BVar8 - BorderStyle_Groove);
        in_stack_fffffffffffffcf4 = BVar8;
        switch(pQVar13) {
        case (QPainter *)0x0:
          in_stack_fffffffffffffcf4 = BorderStyle_Ridge;
          break;
        case (QPainter *)0x1:
          in_stack_fffffffffffffcf4 = BorderStyle_Groove;
          break;
        case (QPainter *)0x2:
          in_stack_fffffffffffffcf4 = BorderStyle_Outset;
          break;
        case (QPainter *)0x3:
          in_stack_fffffffffffffcf4 = BorderStyle_Inset;
        }
        painter_00 = in_stack_fffffffffffffc80;
        cellRect_00 = in_stack_fffffffffffffc78;
        QTextTable::format((QTextTable *)in_stack_fffffffffffffbe0);
        QTextFrameFormat::borderBrush((QTextFrameFormat *)in_stack_fffffffffffffbc8);
        drawBorder((QTextDocumentLayoutPrivate *)
                   CONCAT44(iVar6,CONCAT13(uVar18,CONCAT12(bVar17,in_stack_fffffffffffffcc8))),
                   pQVar13,(QRectF *)CONCAT44(BVar8,in_stack_fffffffffffffcb8),(qreal)topMargin_00,
                   dVar16,(qreal)in_stack_fffffffffffffca0,(QBrush *)in_stack_fffffffffffffc98,
                   (BorderStyle)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        QBrush::~QBrush((QBrush *)0x7fc799);
        QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7fc7a6);
        QPainter::setBrush((QPainter *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                           ,(QBrush *)in_stack_fffffffffffffbe0);
        QPainter::setPen((QPainter *)in_stack_fffffffffffffbd8,(QPen *)in_stack_fffffffffffffbd0);
        QPen::~QPen((QPen *)0x7fc7dd);
        QBrush::~QBrush((QBrush *)0x7fc7ea);
      }
    }
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    QTextTableCell::format
              ((QTextTableCell *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    QTextFormat::background(in_stack_fffffffffffffbc8);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7fc830);
    local_158 = 0xffffffffffffffff;
    local_150 = 0xffffffffffffffff;
    local_160 = QPainter::brushOrigin((QPainter *)in_stack_fffffffffffffbd0);
    QPointF::QPointF(in_stack_fffffffffffffbd0,(QPoint *)in_stack_fffffffffffffbc8);
    BVar9 = QBrush::style((QBrush *)0x7fc885);
    if (BVar9 != NoBrush) {
      QVar14 = QTextDocument::pageSize((QTextDocument *)in_stack_fffffffffffffbd8);
      local_170.ht = QVar14.ht;
      local_170.wd = QVar14.wd;
      qVar1 = QSizeF::height(&local_170);
      if (qVar1 <= 0.0) {
        local_394 = 0;
        local_398 = 0;
      }
      else {
        qVar2 = QRectF::top(in_RSI);
        local_394 = (int)(qVar2 / qVar1);
        qVar2 = QRectF::bottom(in_RSI);
        local_398 = (int)(qVar2 / qVar1);
      }
      local_324 = local_394;
      if (local_394 == local_398) {
        QBrush::QBrush((QBrush *)in_stack_fffffffffffffbd0,(QBrush *)in_stack_fffffffffffffbc8);
        QVar15 = QRectF::topLeft(in_stack_fffffffffffffbd8);
        local_180 = QVar15.yp;
        local_188 = QVar15.xp;
        QRectF::QRectF(&local_1a8);
        fillBackground((QPainter *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                       (QRectF *)in_stack_fffffffffffffbf0,
                       (QBrush *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                       (QPointF *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
        QBrush::~QBrush((QBrush *)0x7fca15);
      }
      else {
        for (; local_324 <= local_398; local_324 = local_324 + 1) {
          local_1c8.xp = -NAN;
          local_1c8.yp = -NAN;
          local_1c8.w = -NAN;
          local_1c8.h = -NAN;
          local_1d8 = QRectF::toRect((QRectF *)
                                     CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
          QRectF::QRectF(in_stack_fffffffffffffbe0,(QRect *)in_stack_fffffffffffffbd8);
          if (local_394 != local_398) {
            local_1e8 = (double)local_324 * qVar1 + (double)cellRect_00;
            local_1f0 = QRectF::top((QRectF *)(in_RCX + 0x18));
            pdVar11 = qMax<double>(&local_1e8,&local_1f0);
            local_1e0 = *pdVar11;
            local_200 = (double)(local_324 + 1) * qVar1 + -(double)painter_00;
            local_208 = QRectF::bottom((QRectF *)(in_RCX + 0x18));
            pdVar11 = qMin<double>(&local_200,&local_208);
            local_1f8 = *pdVar11;
            local_210 = QRectF::top(&local_1c8);
            pdVar11 = qMax<double>(&local_210,&local_1e0);
            QRectF::setTop(&local_1c8,*pdVar11);
            local_218 = QRectF::bottom(&local_1c8);
            pdVar11 = qMin<double>(&local_218,&local_1f8);
            QRectF::setBottom(&local_1c8,*pdVar11);
            qVar2 = QRectF::bottom(&local_1c8);
            qVar3 = QRectF::top(&local_1c8);
            if (qVar3 < qVar2) {
              QBrush::QBrush((QBrush *)in_stack_fffffffffffffbd0,(QBrush *)in_stack_fffffffffffffbc8
                            );
              QVar15 = QRectF::topLeft(in_stack_fffffffffffffbd8);
              in_stack_fffffffffffffdd8 = QVar15.yp;
              in_stack_fffffffffffffdd0 = QVar15.xp;
              QRectF::QRectF((QRectF *)&stack0xfffffffffffffdb0);
              fillBackground((QPainter *)
                             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                             (QRectF *)in_stack_fffffffffffffbf0,
                             (QBrush *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)
                             ,(QPointF *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
              QBrush::~QBrush((QBrush *)0x7fcce4);
            }
          }
        }
      }
      BVar9 = QBrush::style((QBrush *)0x7fcd0b);
      if (1 < (int)BVar9) {
        QVar15 = QRectF::topLeft(in_stack_fffffffffffffbd8);
        local_258 = QVar15.yp;
        local_260 = QVar15.xp;
        QPainter::setBrushOrigin((QPainter *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      }
    }
    if ((bVar5 & 1) != 0) {
      drawTableCellBorder((QTextDocumentLayoutPrivate *)
                          CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),cellRect_00,
                          (QPainter *)painter_00,
                          (QTextTable *)
                          CONCAT44(iVar7,CONCAT13(bVar5,CONCAT12(bVar21,CONCAT11(bVar20,bVar19)))),
                          in_stack_fffffffffffffcf8,
                          (QTextTableCell *)
                          CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    }
    local_264 = 0xaaaaaaaa;
    QTextTable::columns((QTextTable *)in_stack_fffffffffffffbd0);
    pQVar12 = QList<QFixed>::at((QList<QFixed> *)in_stack_fffffffffffffbd0,
                                (qsizetype)in_stack_fffffffffffffbc8);
    local_264 = pQVar12->val;
    local_278.xp = -NAN;
    local_278.yp = -NAN;
    this_00 = (QTextTableCell *)QRectF::left(in_RSI);
    qVar1 = QFixed::toReal(local_cc);
    dVar16 = (double)this_00 + qVar1;
    qVar1 = QRectF::top(in_RSI);
    local_27c = QFixed::operator+((QFixed *)in_stack_fffffffffffffbc8,(int)in_stack_fffffffffffffbd0
                                 );
    qVar2 = QFixed::toReal(&local_27c);
    QPointF::QPointF(&local_278,dVar16,qVar1 + qVar2);
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::QTextBlock((QTextBlock *)local_a8);
    QTextTableCell::begin(this_00);
    QTextTable::rows((QTextTable *)in_stack_fffffffffffffbd0);
    QMultiHash<int,_QTextFrame_*>::values
              ((QMultiHash<int,_QTextFrame_*> *)in_stack_fffffffffffffbd8,
               (int *)in_stack_fffffffffffffbd0);
    it.cf = (QTextFrame *)in_stack_fffffffffffffdd0;
    it.f = (QTextFrame *)in_stack_fffffffffffffdc0._0_8_;
    it.b = in_stack_fffffffffffffdc0._8_4_;
    it.e = in_stack_fffffffffffffdc0._12_4_;
    it._24_8_ = in_stack_fffffffffffffdd8;
    drawFlow(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88,it,in_stack_fffffffffffffc80,
             (QTextBlock *)in_stack_fffffffffffffc78);
    QList<QTextFrame_*>::~QList((QList<QTextFrame_*> *)0x7fcfd7);
    bVar4 = QTextBlock::isValid(local_c0);
    p = local_c0;
    pQVar13 = local_b8;
    if (bVar4) {
      QTextBlock::operator=(in_stack_00000018,(QTextBlock *)local_a8);
      *in_stack_00000020 = local_278.xp;
      in_stack_00000020[1] = local_278.yp;
      p = local_c0;
      pQVar13 = local_b8;
    }
    BVar9 = QBrush::style((QBrush *)0x7fd02b);
    if (1 < (int)BVar9) {
      QPainter::setBrushOrigin(pQVar13,(QPointF *)p);
    }
    QBrush::~QBrush((QBrush *)0x7fd052);
  }
  QTextTableCell::~QTextTableCell((QTextTableCell *)local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentLayoutPrivate::drawTableCell(const QRectF &cellRect, QPainter *painter, const QAbstractTextDocumentLayout::PaintContext &cell_context,
                                               QTextTable *table, QTextTableData *td, int r, int c,
                                               QTextBlock *cursorBlockNeedingRepaint, QPointF *cursorBlockOffset) const
{
    QTextTableCell cell = table->cellAt(r, c);
    int rspan = cell.rowSpan();
    int cspan = cell.columnSpan();
    if (rspan != 1) {
        int cr = cell.row();
        if (cr != r)
            return;
    }
    if (cspan != 1) {
        int cc = cell.column();
        if (cc != c)
            return;
    }

    const QFixed leftPadding = td->leftPadding(table, cell);
    const QFixed topPadding = td->topPadding(table, cell);

    qreal topMargin = (td->effectiveTopMargin + td->cellSpacing + td->border).toReal();
    qreal bottomMargin = (td->effectiveBottomMargin + td->cellSpacing + td->border).toReal();

    const int headerRowCount = qMin(table->format().headerRowCount(), table->rows() - 1);
    if (r >= headerRowCount)
        topMargin += td->headerHeight.toReal();

    // If cell border configured, don't draw default border for cells. It will be taken care later by
    // drawTableCellBorder().
    bool cellBorderConfigured = (cell.format().hasProperty(QTextFormat::TableCellLeftBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellTopBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellRightBorder) ||
                                 cell.format().hasProperty(QTextFormat::TableCellBottomBorder));

    if (!td->borderCollapse && td->border != 0 && !cellBorderConfigured) {
        const QBrush oldBrush = painter->brush();
        const QPen oldPen = painter->pen();

        // If border is configured for the table (and not explicitly for the cell), then
        // always draw 1px border around the cell
        const qreal border = 1;

        QRectF borderRect(cellRect.left() - border, cellRect.top() - border, cellRect.width() + border, cellRect.height() + border);

        // invert the border style for cells
        QTextFrameFormat::BorderStyle cellBorder = table->format().borderStyle();
        switch (cellBorder) {
        case QTextFrameFormat::BorderStyle_Inset:
            cellBorder = QTextFrameFormat::BorderStyle_Outset;
            break;
        case QTextFrameFormat::BorderStyle_Outset:
            cellBorder = QTextFrameFormat::BorderStyle_Inset;
            break;
        case QTextFrameFormat::BorderStyle_Groove:
            cellBorder = QTextFrameFormat::BorderStyle_Ridge;
            break;
        case QTextFrameFormat::BorderStyle_Ridge:
            cellBorder = QTextFrameFormat::BorderStyle_Groove;
            break;
        default:
            break;
        }

        drawBorder(painter, borderRect, topMargin, bottomMargin,
                   border, table->format().borderBrush(), cellBorder);

        painter->setBrush(oldBrush);
        painter->setPen(oldPen);
    }

    const QBrush bg = cell.format().background();
    const QPointF brushOrigin = painter->brushOrigin();
    if (bg.style() != Qt::NoBrush) {
        const qreal pageHeight = document->pageSize().height();
        const int topPage = pageHeight > 0 ? static_cast<int>(cellRect.top() / pageHeight) : 0;
        const int bottomPage = pageHeight > 0 ? static_cast<int>((cellRect.bottom()) / pageHeight) : 0;

        if (topPage == bottomPage)
            fillBackground(painter, cellRect, bg, cellRect.topLeft());
        else {
            for (int i = topPage; i <= bottomPage; ++i) {
                QRectF clipped = cellRect.toRect();

                if (topPage != bottomPage) {
                    const qreal top = qMax(i * pageHeight + topMargin, cell_context.clip.top());
                    const qreal bottom = qMin((i + 1) * pageHeight - bottomMargin, cell_context.clip.bottom());

                    clipped.setTop(qMax(clipped.top(), top));
                    clipped.setBottom(qMin(clipped.bottom(), bottom));

                    if (clipped.bottom() <= clipped.top())
                        continue;

                    fillBackground(painter, clipped, bg, cellRect.topLeft());
                }
            }
        }

        if (bg.style() > Qt::SolidPattern)
            painter->setBrushOrigin(cellRect.topLeft());
    }

    // paint over the background - otherwise we would have to adjust the background paint cellRect for the border values
    if (cellBorderConfigured)
        drawTableCellBorder(cellRect, painter, table, td, cell);

    const QFixed verticalOffset = td->cellVerticalOffsets.at(c + r * table->columns());

    const QPointF cellPos = QPointF(cellRect.left() + leftPadding.toReal(),
                                    cellRect.top() + (topPadding + verticalOffset).toReal());

    QTextBlock repaintBlock;
    drawFlow(cellPos, painter, cell_context, cell.begin(),
             td->childFrameMap.values(r + c * table->rows()),
             &repaintBlock);
    if (repaintBlock.isValid()) {
        *cursorBlockNeedingRepaint = repaintBlock;
        *cursorBlockOffset = cellPos;
    }

    if (bg.style() > Qt::SolidPattern)
        painter->setBrushOrigin(brushOrigin);
}